

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pettyprof.h
# Opt level: O0

void pepro::impl::ProfileStack::pop(void)

{
  bool bVar1;
  ProfileStack *this;
  ProfileStack *pPVar2;
  ostream *poVar3;
  rep rVar4;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> dur;
  value_type *e;
  stack<pepro::impl::ProfileStack::Entry,_std::deque<pepro::impl::ProfileStack::Entry,_std::allocator<pepro::impl::ProfileStack::Entry>_>_>
  *stack;
  
  this = inst();
  dur.__r = (rep)std::
                 stack<pepro::impl::ProfileStack::Entry,_std::deque<pepro::impl::ProfileStack::Entry,_std::allocator<pepro::impl::ProfileStack::Entry>_>_>
                 ::top(&this->m_stack);
  local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_28.__r = (rep)std::chrono::operator-
                                (&local_30,
                                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)(dur.__r + 8));
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_28);
  pPVar2 = inst();
  bVar1 = std::chrono::operator>=(&local_20,&pPVar2->m_outputThreshold);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"PEPRO ");
    poVar3 = std::operator<<(poVar3,*(char **)dur.__r);
    poVar3 = std::operator<<(poVar3,":\t");
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_20);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)rVar4 / 1000.0);
    poVar3 = std::operator<<(poVar3," (s)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  **(undefined1 **)(dur.__r + 0x10) = 0;
  std::
  stack<pepro::impl::ProfileStack::Entry,_std::deque<pepro::impl::ProfileStack::Entry,_std::allocator<pepro::impl::ProfileStack::Entry>_>_>
  ::pop(&this->m_stack);
  return;
}

Assistant:

static void pop ()
	{
		auto& stack = inst().m_stack;
		const auto& e = stack.top();
		const auto dur = std::chrono::duration_cast<std::chrono::milliseconds>(clock::now() - e.start);
		if (dur >= inst().m_outputThreshold)
			std::cout << "PEPRO " << e.name << ":\t" << dur.count() / 1.e3 << " (s)" << std::endl;
		e.mark->popOnDestruction = false;
		stack.pop();
	}